

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.cpp
# Opt level: O0

void __thiscall WorkQueue::WorkQueue(WorkQueue *this,size_t workerCount,size_t memoryLimit)

{
  ulong in_RSI;
  _Bind<void_(*(std::reference_wrapper<BlockingQueue<std::function<void_()>_>_>))(BlockingQueue<std::function<void_()>_>_&)>
  *in_RDI;
  size_t i;
  BlockingQueue<std::function<void_()>_> *in_stack_ffffffffffffff98;
  tuple<std::reference_wrapper<BlockingQueue<std::function<void_()>_>_>_> *__args;
  tuple<std::reference_wrapper<BlockingQueue<std::function<void_()>_>_>_> *this_00;
  size_t in_stack_ffffffffffffffb8;
  BlockingQueue<std::function<void_()>_> *in_stack_ffffffffffffffc0;
  ulong local_20;
  
  BlockingQueue<std::function<void_()>_>::BlockingQueue
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = &in_RDI[0xe]._M_bound_args;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x15c58d);
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    __args = &in_RDI[0xe]._M_bound_args;
    std::ref<BlockingQueue<std::function<void()>>>(in_stack_ffffffffffffff98);
    std::
    bind<void(&)(BlockingQueue<std::function<void()>>&),std::reference_wrapper<BlockingQueue<std::function<void()>>>>
              ((_func_void_BlockingQueue<std::function<void_()>_>_ptr *)in_RDI,
               (reference_wrapper<BlockingQueue<std::function<void_()>_>_> *)__args);
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<std::_Bind<void(*(std::reference_wrapper<BlockingQueue<std::function<void()>>>))(BlockingQueue<std::function<void()>>&)>>
              ((vector<std::thread,_std::allocator<std::thread>_> *)this_00,in_RDI);
  }
  return;
}

Assistant:

WorkQueue::WorkQueue(size_t workerCount, size_t memoryLimit): queue(memoryLimit)
{
	for (size_t i = 0; i < workerCount; ++i)
		workers.emplace_back(std::bind(workerThreadFun, std::ref(queue)));
}